

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

bool __thiscall FIX::Session::validLogonState(Session *this,MsgType *msgType)

{
  bool bVar1;
  MsgType *msgType_local;
  Session *this_local;
  
  bVar1 = FIX::operator==(&msgType->super_StringField,"A");
  if (((bVar1) && (bVar1 = SessionState::sentReset(&this->m_state), bVar1)) ||
     (bVar1 = SessionState::receivedReset(&this->m_state), bVar1)) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = FIX::operator==(&msgType->super_StringField,"A");
    if (((bVar1) && (bVar1 = SessionState::receivedLogon(&this->m_state), !bVar1)) ||
       ((bVar1 = FIX::operator!=(&msgType->super_StringField,"A"), bVar1 &&
        (bVar1 = SessionState::receivedLogon(&this->m_state), bVar1)))) {
      this_local._7_1_ = true;
    }
    else {
      bVar1 = FIX::operator==(&msgType->super_StringField,"5");
      if ((bVar1) && (bVar1 = SessionState::sentLogon(&this->m_state), bVar1)) {
        this_local._7_1_ = true;
      }
      else {
        bVar1 = FIX::operator!=(&msgType->super_StringField,"5");
        if ((bVar1) && (bVar1 = SessionState::sentLogout(&this->m_state), bVar1)) {
          this_local._7_1_ = true;
        }
        else {
          bVar1 = FIX::operator==(&msgType->super_StringField,"4");
          if (bVar1) {
            this_local._7_1_ = true;
          }
          else {
            bVar1 = FIX::operator==(&msgType->super_StringField,"3");
            if (bVar1) {
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Session::validLogonState(const MsgType &msgType) {
  if ((msgType == MsgType_Logon && m_state.sentReset()) || (m_state.receivedReset())) {
    return true;
  }
  if ((msgType == MsgType_Logon && !m_state.receivedLogon()) || (msgType != MsgType_Logon && m_state.receivedLogon())) {
    return true;
  }
  if (msgType == MsgType_Logout && m_state.sentLogon()) {
    return true;
  }
  if (msgType != MsgType_Logout && m_state.sentLogout()) {
    return true;
  }
  if (msgType == MsgType_SequenceReset) {
    return true;
  }
  if (msgType == MsgType_Reject) {
    return true;
  }

  return false;
}